

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.cpp
# Opt level: O3

void rasterize(vector<Shape,_std::allocator<Shape>_> *shapes,char *file_name,size_t width,
              size_t height)

{
  pointer pEVar1;
  Line *pLVar2;
  long lVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pSVar10;
  undefined4 uVar15;
  size_t sVar11;
  RasterizeLine *pRVar12;
  Shape *pSVar13;
  undefined8 *puVar14;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  size_t sVar19;
  int iVar20;
  undefined1 auVar21 [8];
  pointer pRVar22;
  pointer pRVar23;
  Shape *pSVar24;
  RasterizeLine **ppRVar25;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  _Var26;
  RasterizeLine *pRVar27;
  ulong uVar28;
  Segment *s;
  pointer pSVar29;
  pointer pRVar30;
  pointer pRVar31;
  ulong uVar32;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  __first;
  Shape *shape;
  Shape *pSVar33;
  iterator __position;
  long lVar34;
  long lVar35;
  Shape *pSVar36;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  _Var37;
  ulong uVar38;
  long lVar39;
  Shape *pSVar40;
  pointer pEVar41;
  pointer pSVar42;
  _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  *this;
  ulong uVar43;
  float fVar44;
  undefined8 uVar45;
  undefined8 extraout_XMM0_Qb;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  _Var46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  ShapeMap shapes_1;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  lines;
  Pixmap pixmap;
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  events;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_208;
  pointer local_200;
  RasterizeLine **local_1d8;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  Shape local_180;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
  local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  local_148;
  Type local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  Pixmap local_f8;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
  local_c8;
  size_t local_a0;
  __normal_iterator<const_(anonymous_namespace)::RasterizeLine_**,_std::vector<const_(anonymous_namespace)::RasterizeLine_*,_std::allocator<const_(anonymous_namespace)::RasterizeLine_*>_>_>
  local_98;
  undefined1 local_90 [8];
  int local_88;
  char *local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [16];
  
  uStack_100 = local_108;
  local_108 = (undefined1  [8])width;
  local_148.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.c.
  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar24 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar40 = (shapes->super__Vector_base<Shape,_std::allocator<Shape>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_80 = file_name;
  if (pSVar24 != pSVar40) {
    do {
      pSVar10 = (pSVar24->segments).super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pSVar29 = (pSVar24->segments).super__Vector_base<Segment,_std::allocator<Segment>_>.
                     _M_impl.super__Vector_impl_data._M_start; pSVar29 != pSVar10;
          pSVar29 = pSVar29 + 1) {
        pSVar42 = (pointer)(((long)local_148.
                                   super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_148.
                                   super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
        local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pSVar24;
        if (pSVar29->y1 < pSVar29->y0 || pSVar29->y1 == pSVar29->y0) {
          local_188 = *(undefined1 (*) [8])&pSVar29->line;
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_180.segments.
                                 super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,-1);
          std::
          vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
          ::push_back(&local_148,(value_type *)local_188);
          local_188 = (undefined1  [8])((ulong)(uint)pSVar29->y1 << 0x20);
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar42;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_c8,(value_type *)local_188);
          local_188._4_4_ = pSVar29->y0;
          local_188._0_4_ = 1.4013e-45;
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar42;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_c8,(value_type *)local_188);
        }
        else {
          local_188 = *(undefined1 (*) [8])&pSVar29->line;
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_180.segments.
                                 super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,1);
          std::
          vector<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
          ::push_back(&local_148,(value_type *)local_188);
          local_188 = (undefined1  [8])((ulong)(uint)pSVar29->y0 << 0x20);
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar42;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_c8,(value_type *)local_188);
          local_188._4_4_ = pSVar29->y1;
          local_188._0_4_ = 1.4013e-45;
          local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
          super__Vector_impl_data._M_start = pSVar42;
          std::
          priority_queue<(anonymous_namespace)::Event,_std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>,_std::greater<(anonymous_namespace)::Event>_>
          ::push(&local_c8,(value_type *)local_188);
        }
      }
      pSVar24 = pSVar24 + 1;
    } while (pSVar24 != pSVar40);
  }
  auVar21 = local_108;
  std::vector<Color,_std::allocator<Color>_>::vector
            (&local_f8.pixels,height * (long)local_108,(allocator_type *)local_188);
  local_f8.width = (size_t)auVar21;
  if (local_c8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_c8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1d8 = (RasterizeLine **)0x0;
    __first._M_current = (RasterizeLine **)0x0;
  }
  else {
    local_1c8._0_4_ =
         (local_c8.c.
          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
          ._M_impl.super__Vector_impl_data._M_start)->y;
    local_1c8._4_4_ = 0;
    local_1c8._8_4_ = 0;
    local_1c8._12_4_ = 0;
    __first._M_current = (RasterizeLine **)0x0;
    local_208._M_current = (RasterizeLine **)0x0;
    local_1d8 = (RasterizeLine **)0x0;
    do {
      local_128 = (local_c8.c.
                   super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type;
      fVar4 = (local_c8.c.
               super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
               ._M_impl.super__Vector_impl_data._M_start)->y;
      local_a0 = (local_c8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->index;
      if (0x10 < (long)local_c8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_c8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].type;
        uVar15 = local_c8.c.
                 super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].y;
        sVar11 = local_c8.c.
                 super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].index;
        fVar51 = (local_c8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->y;
        sVar19 = (local_c8.c.
                  super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ._M_impl.super__Vector_impl_data._M_start)->index;
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].type =
             (local_c8.c.
              super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
              ._M_impl.super__Vector_impl_data._M_start)->type;
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].y = fVar51;
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].index = sVar19;
        uVar38 = (long)local_c8.c.
                       super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (-0x10 - (long)local_c8.c.
                                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        lVar39 = (long)uVar38 >> 4;
        if (lVar39 < 3) {
          lVar34 = 0;
        }
        else {
          lVar35 = 0;
          do {
            lVar3 = lVar35 * 2 + 2;
            lVar34 = lVar35 * 2 + 1;
            if (local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3].y <
                local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar34].y ||
                local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar3].y ==
                local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar34].y) {
              lVar34 = lVar3;
            }
            pEVar1 = local_c8.c.
                     super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar34;
            fVar51 = pEVar1->y;
            sVar19 = pEVar1->index;
            pEVar41 = local_c8.c.
                      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar35;
            pEVar41->type = pEVar1->type;
            pEVar41->y = fVar51;
            pEVar41->index = sVar19;
            lVar35 = lVar34;
          } while (lVar34 < (lVar39 - (lVar39 + -1 >> 0x3f)) + -1 >> 1);
        }
        lVar35 = lVar34;
        if (((uVar38 & 0x10) == 0) && (lVar34 == lVar39 + -2 >> 1)) {
          lVar35 = lVar34 * 2 + 1;
          pEVar1 = local_c8.c.
                   super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar35;
          fVar51 = pEVar1->y;
          sVar19 = pEVar1->index;
          pEVar41 = local_c8.c.
                    super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar34;
          pEVar41->type = pEVar1->type;
          pEVar41->y = fVar51;
          pEVar41->index = sVar19;
        }
        if (0 < lVar35) {
          do {
            lVar39 = (lVar35 - (lVar35 + -1 >> 0x3f)) + -1 >> 1;
            if (local_c8.c.
                super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar39].y <= (float)uVar15) break;
            pEVar41 = local_c8.c.
                      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar39;
            fVar51 = pEVar41->y;
            sVar19 = pEVar41->index;
            pEVar1 = local_c8.c.
                     super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar35;
            pEVar1->type = pEVar41->type;
            pEVar1->y = fVar51;
            pEVar1->index = sVar19;
            bVar16 = 2 < lVar35;
            lVar35 = lVar39;
          } while (bVar16);
        }
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar35].type = uVar9;
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar35].y = (float)uVar15;
        local_c8.c.
        super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar35].index = sVar11;
      }
      local_c8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_c8.c.
           super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      if ((float)local_1c8._0_4_ < fVar4) {
        local_70 = (long)local_208._M_current - (long)__first._M_current;
        local_68 = (long)local_208._M_current - (long)__first._M_current >> 3;
        lVar39 = 0x3f;
        if (local_68 != 0) {
          for (; local_68 >> lVar39 == 0; lVar39 = lVar39 + -1) {
          }
        }
        local_78 = (ulong)(((uint)lVar39 ^ 0x3f) * 2) ^ 0x7e;
        local_98._M_current = __first._M_current + 0x10;
        do {
          local_158._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_1c8._0_4_;
          uStack_154 = local_1c8._4_4_;
          uStack_150 = local_1c8._8_4_;
          uStack_14c = local_1c8._12_4_;
          if (__first._M_current != local_208._M_current) {
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                      (__first,local_208,local_78,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                        )local_1c8._0_4_);
            _Var26._M_current = local_98._M_current;
            if (local_70 < 0x81) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                        (__first,local_208,local_158);
            }
            else {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                        (__first,local_98,local_158);
              _Var37._M_current = local_98._M_current;
              while (_Var26._M_current != local_208._M_current) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::RasterizeLine_const**,std::vector<(anonymous_namespace)::RasterizeLine_const*,std::allocator<(anonymous_namespace)::RasterizeLine_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<rasterize(std::vector<Shape,std::allocator<Shape>>const&,char_const*,unsigned_long,unsigned_long)::__0>>
                          (_Var37,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]raster_rasterizer_cpp:193:58)>
                                   )local_158._M_comp.y);
                _Var37._M_current = _Var37._M_current + 1;
                _Var26._M_current = _Var37._M_current;
              }
            }
          }
          local_1c8 = ZEXT416((uint)fVar4);
          if (1 < local_68) {
            uVar38 = 1;
            local_1c8 = ZEXT416((uint)fVar4);
            pRVar27 = *__first._M_current;
            fVar51 = ((*__first._M_current)->super_Line).m;
            do {
              pRVar12 = __first._M_current[uVar38];
              fVar47 = (pRVar12->super_Line).m;
              if ((fVar51 != fVar47) || (NAN(fVar51) || NAN(fVar47))) {
                fVar51 = ((pRVar12->super_Line).x0 - (pRVar27->super_Line).x0) / (fVar51 - fVar47);
                uVar56 = 0;
                uVar57 = 0;
                uVar58 = 0;
                if (fVar51 <= (float)local_158._M_comp.y || (float)local_1c8._0_4_ <= fVar51) {
                  fVar51 = (float)local_1c8._0_4_;
                  uVar56 = local_1c8._4_4_;
                  uVar57 = local_1c8._8_4_;
                  uVar58 = local_1c8._12_4_;
                }
                local_1c8._4_4_ = uVar56;
                local_1c8._0_4_ = fVar51;
                local_1c8._8_4_ = uVar57;
                local_1c8._12_4_ = uVar58;
              }
              uVar38 = uVar38 + 1;
              pRVar27 = pRVar12;
              fVar51 = fVar47;
            } while (local_68 != uVar38);
          }
          _Var46 = local_158;
          if (__first._M_current == local_208._M_current) {
            local_1b8 = (pointer)0x0;
            pRVar30 = (pointer)0x0;
            local_200 = (pointer)0x0;
          }
          else {
            local_200 = (pointer)0x0;
            pRVar30 = (pointer)0x0;
            local_1b8 = (pointer)0x0;
            uVar38 = local_68;
            _Var26._M_current = __first._M_current;
            do {
              pRVar27 = *_Var26._M_current;
              if (pRVar30 == local_1b8) {
                uVar32 = (long)pRVar30 - (long)local_200;
                if (uVar32 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar28 = ((long)uVar32 >> 3) * -0x5555555555555555;
                uVar43 = uVar28;
                if (pRVar30 == local_200) {
                  uVar43 = 1;
                }
                this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                        *)(uVar43 + uVar28);
                if ((_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                     *)0x555555555555554 < this) {
                  this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          *)0x555555555555555;
                }
                if (CARRY8(uVar43,uVar28)) {
                  this = (_Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          *)0x555555555555555;
                }
                pRVar22 = std::
                          _Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          ::_M_allocate(this,uVar38);
                *(Shape **)((long)pRVar22 + uVar32 + 0x10) = pRVar27->shape;
                iVar20 = pRVar27->direction;
                uVar56 = *(undefined4 *)&pRVar27->field_0xc;
                pLVar2 = (Line *)((long)pRVar22 + uVar32);
                *pLVar2 = pRVar27->super_Line;
                pLVar2[1].m = (float)iVar20;
                pLVar2[1].x0 = (float)uVar56;
                pRVar31 = pRVar22;
                for (pRVar23 = local_200; pRVar30 != pRVar23; pRVar23 = pRVar23 + 1) {
                  pRVar31->shape = pRVar23->shape;
                  iVar20 = pRVar23->direction;
                  uVar56 = *(undefined4 *)&pRVar23->field_0xc;
                  pRVar31->super_Line = pRVar23->super_Line;
                  pRVar31->direction = iVar20;
                  *(undefined4 *)&pRVar31->field_0xc = uVar56;
                  pRVar31 = pRVar31 + 1;
                }
                if (local_200 != (pointer)0x0) {
                  operator_delete(local_200,uVar32);
                  uVar38 = uVar32;
                }
                local_1b8 = pRVar22 + (long)this;
                _Var46._M_comp.y = (anon_class_4_1_54a39819)(anon_class_4_1_54a39819)local_158;
                local_200 = pRVar22;
              }
              else {
                pRVar30->shape = pRVar27->shape;
                iVar20 = pRVar27->direction;
                uVar56 = *(undefined4 *)&pRVar27->field_0xc;
                pRVar30->super_Line = pRVar27->super_Line;
                pRVar30->direction = iVar20;
                *(undefined4 *)&pRVar30->field_0xc = uVar56;
                pRVar31 = pRVar30;
              }
              pRVar30 = pRVar31 + 1;
              _Var26._M_current = _Var26._M_current + 1;
            } while (_Var26._M_current != local_208._M_current);
          }
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_f8.width;
          auVar18._8_8_ = 0;
          auVar18._0_8_ =
               (long)local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
          uVar38 = SUB168(auVar18 / auVar17,0);
          if ((long)uVar38 < 0) {
            fVar51 = (float)((ulong)(SUB164(auVar18 / auVar17,0) & 1) | uVar38 >> 1);
            fVar51 = fVar51 + fVar51;
          }
          else {
            fVar51 = (float)(long)uVar38;
          }
          fVar47 = 0.0;
          if (0.0 <= (float)_Var46._M_comp.y) {
            fVar47 = (float)_Var46._M_comp.y;
          }
          uVar38 = (long)(fVar47 - 9.223372e+18) & (long)fVar47 >> 0x3f | (long)fVar47;
          fVar52 = (float)uVar38;
          fVar47 = fVar51 + -0.5;
          if ((float)local_1c8._0_4_ <= fVar51 + -0.5) {
            fVar47 = (float)local_1c8._0_4_;
          }
          if (fVar52 < fVar47) {
            uVar32 = ((long)pRVar30 - (long)local_200 >> 3) * -0x5555555555555555;
            local_58 = uVar32;
            local_124 = fVar47;
            do {
              local_60 = uVar38 + 1;
              local_50 = uVar38;
              fVar51 = (float)(uVar38 + 1);
              local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_180.segments.
                                    super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                    super__Vector_impl_data._M_start & 0xffffffff00000000);
              local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_180.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_180.segments.super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_180;
              local_180.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_180;
              if (1 < uVar32) {
                local_d8 = (float)local_158;
                if ((float)local_158._M_comp.y <= fVar52) {
                  local_d8 = fVar52;
                }
                fVar47 = (float)local_1c8._0_4_;
                if (fVar51 <= (float)local_1c8._0_4_) {
                  fVar47 = fVar51;
                }
                uStack_d4 = uStack_154;
                uStack_d0 = uStack_150;
                uStack_cc = uStack_14c;
                fVar44 = fVar47 - local_d8;
                uVar38 = 1;
                do {
                  pSVar24 = local_200[uVar38 - 1].shape;
                  __position._M_node = (_Base_ptr)&local_180;
                  pSVar40 = (Shape *)local_180.segments.
                                     super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                  if ((Shape *)local_180.segments.
                               super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                               super__Vector_impl_data._M_finish == (Shape *)0x0) {
LAB_0010e4c9:
                    local_90 = (undefined1  [8])pSVar24;
                    local_88 = local_200[uVar38 - 1].direction;
                    std::
                    _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                    ::_M_emplace_unique<std::pair<Shape_const*,int>>
                              ((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                                *)local_188,(pair<const_Shape_*,_int> *)local_90);
                  }
                  else {
                    do {
                      pSVar36 = pSVar40;
                      pSVar33 = (Shape *)__position._M_node;
                      pSVar13 = (Shape *)(pSVar36->paint).
                                         super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_refcount._M_pi;
                      __position._M_node = (_Base_ptr)pSVar36;
                      if (pSVar13 < pSVar24) {
                        __position._M_node = (_Base_ptr)pSVar33;
                      }
                      pSVar40 = (Shape *)(&(pSVar36->segments).
                                           super__Vector_base<Segment,_std::allocator<Segment>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage)
                                         [pSVar13 < pSVar24];
                    } while (pSVar40 != (Shape *)0x0);
                    if ((Shape *)__position._M_node == &local_180) goto LAB_0010e4c9;
                    pSVar40 = pSVar36;
                    if (pSVar13 < pSVar24) {
                      pSVar40 = pSVar33;
                    }
                    if (pSVar24 < (Shape *)(pSVar40->paint).
                                           super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi) goto LAB_0010e4c9;
                    if (pSVar13 < pSVar24) {
                      pSVar36 = pSVar33;
                    }
                    pSVar36 = pSVar36 + 1;
                    *(int *)&(pSVar36->segments).
                             super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                             super__Vector_impl_data._M_start =
                         *(int *)&(pSVar36->segments).
                                  super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                  super__Vector_impl_data._M_start + local_200[uVar38 - 1].direction
                    ;
                    if (*(int *)&(pSVar36->segments).
                                 super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                 super__Vector_impl_data._M_start == 0) {
                      std::
                      _Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                      ::erase_abi_cxx11_((_Rb_tree<Shape_const*,std::pair<Shape_const*const,int>,std::_Select1st<std::pair<Shape_const*const,int>>,std::less<Shape_const*>,std::allocator<std::pair<Shape_const*const,int>>>
                                          *)local_188,__position);
                    }
                  }
                  if (local_180.paint.super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    pRVar30 = local_200 + uVar38;
                    fVar54 = pRVar30[-1].super_Line.m;
                    fVar53 = pRVar30[-1].super_Line.x0;
                    fVar48 = fVar54 * local_d8 + fVar53;
                    fVar53 = fVar54 * fVar47 + fVar53;
                    fVar54 = fVar53;
                    if (fVar48 <= fVar53) {
                      fVar54 = fVar48;
                    }
                    fVar60 = 0.0;
                    if (0.0 <= fVar54) {
                      fVar60 = fVar54;
                    }
                    uVar32 = (long)(fVar60 - 9.223372e+18) & (long)fVar60 >> 0x3f | (long)fVar60;
                    fVar59 = (float)uVar32;
                    fVar60 = (pRVar30->super_Line).m;
                    fVar62 = (pRVar30->super_Line).x0;
                    fVar55 = fVar60 * local_d8 + fVar62;
                    fVar62 = fVar60 * fVar47 + fVar62;
                    fVar60 = fVar55;
                    if (fVar55 <= fVar62) {
                      fVar60 = fVar62;
                    }
                    fVar49 = (float)local_f8.width + -0.5;
                    if (fVar60 <= (float)local_f8.width + -0.5) {
                      fVar49 = fVar60;
                    }
                    if (fVar59 < fVar49) {
                      local_11c = fVar48;
                      if (fVar48 <= fVar53) {
                        local_11c = fVar53;
                      }
                      if (fVar55 <= fVar62) {
                        fVar62 = fVar55;
                      }
                      fVar55 = (local_11c - fVar54) / fVar44;
                      fVar61 = fVar54 - fVar55 * local_d8;
                      local_120 = fVar53 + fVar48;
                      fVar53 = (fVar60 - fVar62) / fVar44;
                      fVar48 = fVar62 - fVar53 * local_d8;
                      local_110 = fVar49;
                      local_114 = fVar62;
                      local_118 = fVar60;
                      do {
                        local_10c = (float)(uVar32 + 1);
                        fVar60 = fVar44;
                        if (fVar59 < local_11c) {
                          if (fVar54 <= fVar59) {
                            fVar60 = (((local_11c + fVar59) - fVar59) - fVar59) *
                                     (fVar47 - (fVar59 - fVar61) / fVar55);
                          }
                          else {
                            fVar60 = ((local_120 - fVar59) - fVar59) * fVar44;
                          }
                          fVar60 = fVar60 * -0.5 + fVar44;
                          if (local_10c < local_11c) {
                            fVar60 = fVar60 + (((local_11c + local_10c) - local_10c) - local_10c) *
                                              (fVar47 - (local_10c - fVar61) / fVar55) * 0.5;
                          }
                        }
                        if (local_114 < local_10c) {
                          if (local_10c <= local_118) {
                            fVar62 = (((local_10c + local_10c) - local_114) - local_10c) *
                                     ((local_10c - fVar48) / fVar53 - local_d8);
                          }
                          else {
                            fVar62 = (((local_10c + local_10c) - local_114) - local_118) * fVar44;
                          }
                          fVar60 = fVar60 + fVar62 * -0.5;
                          if (local_114 < fVar59) {
                            fVar60 = fVar60 + (((fVar59 + fVar59) - local_114) - fVar59) *
                                              ((fVar59 - fVar48) / fVar53 - local_d8) * 0.5;
                          }
                        }
                        fVar50 = 0.0;
                        fVar49 = 0.0;
                        fVar62 = 0.0;
                        local_48 = ZEXT416((uint)fVar60);
                        local_90._4_4_ = fVar52 + 0.5;
                        local_90._0_4_ = fVar59 + 0.5;
                        _local_198 = ZEXT416(0);
                        pSVar24 = (Shape *)local_180.segments.
                                           super__Vector_base<Segment,_std::allocator<Segment>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                        fVar60 = fVar52 + 0.5;
                        _local_108 = _local_198;
                        if ((Shape *)local_180.segments.
                                     super__Vector_base<Segment,_std::allocator<Segment>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage == &local_180) {
                          local_198 = (undefined1  [8])0;
                        }
                        else {
                          do {
                            puVar14 = *(undefined8 **)
                                       &(pSVar24->paint).
                                        super___shared_ptr<Paint,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi[1]._M_use_count;
                            uVar45 = (**(code **)*puVar14)
                                               (puVar14,(pair<const_Shape_*,_int> *)local_90);
                            fVar59 = 1.0 - fVar62;
                            local_108._4_4_ =
                                 (float)local_108._4_4_ * fVar59 + (float)((ulong)uVar45 >> 0x20);
                            local_108._0_4_ = (float)local_108._0_4_ * fVar59 + (float)uVar45;
                            uStack_100._0_4_ = (float)uStack_100 * fVar59 + (float)extraout_XMM0_Qb;
                            uStack_100._4_4_ =
                                 uStack_100._4_4_ * fVar59 +
                                 (float)((ulong)extraout_XMM0_Qb >> 0x20);
                            local_198._4_4_ = (float)local_198._4_4_ * fVar59 + fVar62;
                            local_198._0_4_ = (float)local_198._0_4_ * fVar59 + fVar60;
                            fStack_190 = fStack_190 * fVar59 + fVar49;
                            fStack_18c = fStack_18c * fVar59 + fVar50;
                            pSVar24 = (Shape *)std::_Rb_tree_increment
                                                         ((_Rb_tree_node_base *)pSVar24);
                          } while (pSVar24 != &local_180);
                        }
                        lVar39 = local_f8.width * local_50;
                        uVar5 = local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar39 + uVar32].r;
                        uVar7 = local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar39 + uVar32].g;
                        uVar6 = local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar39 + uVar32].b;
                        uVar8 = local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar39 + uVar32].a;
                        local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar39 + uVar32].r =
                             (float)uVar5 + (float)local_108._0_4_ * (float)local_48._0_4_;
                        local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar39 + uVar32].g =
                             (float)uVar7 + (float)local_108._4_4_ * (float)local_48._0_4_;
                        local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar39 + uVar32].b =
                             (float)local_48._0_4_ * (float)local_198._0_4_ + (float)uVar6;
                        local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar39 + uVar32].a =
                             (float)local_48._0_4_ * (float)local_198._4_4_ + (float)uVar8;
                        uVar32 = uVar32 + 1;
                        fVar59 = local_10c;
                      } while (local_10c < local_110);
                    }
                  }
                  uVar38 = uVar38 + 1;
                  uVar32 = local_58;
                } while (uVar38 != local_58);
              }
              std::
              _Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
              ::~_Rb_tree((_Rb_tree<const_Shape_*,_std::pair<const_Shape_*const,_int>,_std::_Select1st<std::pair<const_Shape_*const,_int>_>,_std::less<const_Shape_*>,_std::allocator<std::pair<const_Shape_*const,_int>_>_>
                           *)local_188);
              uVar38 = local_60;
              fVar52 = fVar51;
            } while (fVar51 < local_124);
          }
          if (local_200 != (pointer)0x0) {
            operator_delete(local_200,(long)local_1b8 - (long)local_200);
          }
        } while ((float)local_1c8._0_4_ < fVar4);
      }
      if (local_128 == LINE_END) {
        pRVar27 = local_148.
                  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_a0;
        uVar38 = (long)local_208._M_current - (long)__first._M_current;
        _Var26._M_current = __first._M_current;
        if (0 < (long)uVar38 >> 5) {
          _Var26._M_current = (uVar38 & 0xffffffffffffffe0) + __first._M_current;
          lVar39 = ((long)uVar38 >> 5) + 1;
          _Var37._M_current = __first._M_current + 2;
          do {
            if (_Var37._M_current[-2] == pRVar27) {
              _Var37._M_current = _Var37._M_current + -2;
              goto LAB_0010ebf1;
            }
            if (_Var37._M_current[-1] == pRVar27) {
              _Var37._M_current = _Var37._M_current + -1;
              goto LAB_0010ebf1;
            }
            if (*_Var37._M_current == pRVar27) goto LAB_0010ebf1;
            if (_Var37._M_current[1] == pRVar27) {
              _Var37._M_current = _Var37._M_current + 1;
              goto LAB_0010ebf1;
            }
            lVar39 = lVar39 + -1;
            _Var37._M_current = _Var37._M_current + 4;
          } while (1 < lVar39);
          uVar38 = (long)local_208._M_current - (long)_Var26._M_current;
        }
        lVar39 = (long)uVar38 >> 3;
        if (lVar39 == 1) {
LAB_0010eb85:
          _Var37._M_current = _Var26._M_current;
          if (*_Var26._M_current != pRVar27) {
            _Var37._M_current = local_208._M_current;
          }
        }
        else if (lVar39 == 2) {
LAB_0010eb7c:
          _Var37._M_current = _Var26._M_current;
          if (*_Var26._M_current != pRVar27) {
            _Var26._M_current = _Var26._M_current + 1;
            goto LAB_0010eb85;
          }
        }
        else {
          _Var37._M_current = local_208._M_current;
          if ((lVar39 == 3) &&
             (_Var37._M_current = _Var26._M_current, *_Var26._M_current != pRVar27)) {
            _Var26._M_current = _Var26._M_current + 1;
            goto LAB_0010eb7c;
          }
        }
LAB_0010ebf1:
        ppRVar25 = _Var37._M_current + 1;
        if (ppRVar25 != local_208._M_current) {
          memmove(_Var37._M_current,ppRVar25,(long)local_208._M_current - (long)ppRVar25);
        }
        local_208._M_current = local_208._M_current + -1;
      }
      else if (local_128 == LINE_START) {
        pRVar27 = local_148.
                  super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_a0;
        if (local_208._M_current == local_1d8) {
          uVar38 = (long)local_208._M_current - (long)__first._M_current;
          if (uVar38 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar43 = (long)uVar38 >> 3;
          uVar32 = uVar43;
          if (local_208._M_current == __first._M_current) {
            uVar32 = 1;
          }
          uVar28 = uVar32 + uVar43;
          if (0xffffffffffffffe < uVar28) {
            uVar28 = 0xfffffffffffffff;
          }
          if (CARRY8(uVar32,uVar43)) {
            uVar28 = 0xfffffffffffffff;
          }
          if (uVar28 == 0) {
            ppRVar25 = (RasterizeLine **)0x0;
          }
          else {
            ppRVar25 = (RasterizeLine **)operator_new(uVar28 * 8);
          }
          ppRVar25[uVar43] = pRVar27;
          if (0 < (long)uVar38) {
            memmove(ppRVar25,__first._M_current,uVar38);
          }
          if (__first._M_current != (RasterizeLine **)0x0) {
            operator_delete(__first._M_current,uVar38);
          }
          local_208._M_current = ppRVar25 + uVar38 + 8;
          local_1d8 = ppRVar25 + uVar28;
          __first._M_current = ppRVar25;
        }
        else {
          *local_208._M_current = pRVar27;
          local_208._M_current = local_208._M_current + 1;
        }
      }
    } while (local_c8.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_c8.c.
             super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  write_png(&local_f8,local_80);
  if (__first._M_current != (RasterizeLine **)0x0) {
    operator_delete(__first._M_current,(long)local_1d8 - (long)__first._M_current);
  }
  if (local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.pixels.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.c.
      super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.c.
                    super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.c.
                          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.c.
                          super__Vector_base<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.
      super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<(anonymous_namespace)::RasterizeLine,_std::allocator<(anonymous_namespace)::RasterizeLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void rasterize(const std::vector<Shape>& shapes, const char* file_name, size_t width, size_t height) {
	// collect lines and events
	std::vector<RasterizeLine> lines;
	std::priority_queue<Event, std::vector<Event>, std::greater<Event>> events;
	for (const Shape& shape: shapes) {
		for (const Segment& s: shape.segments) {
			const size_t index = lines.size();
			if (s.y0 < s.y1) {
				lines.push_back(RasterizeLine(s.line, 1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y0, index));
				events.push(Event(Event::Type::LINE_END, s.y1, index));
			}
			else {
				lines.push_back(RasterizeLine(s.line, -1, &shape));
				events.push(Event(Event::Type::LINE_START, s.y1, index));
				events.push(Event(Event::Type::LINE_END, s.y0, index));
			}
		}
	}

	Pixmap pixmap(width, height);

	float y = events.empty() ? 0.f : events.top().y;
	std::vector<const RasterizeLine*> current_lines;
	while (!events.empty()) {
		Event event = events.top();
		events.pop();
		while (y < event.y) {
			std::sort(current_lines.begin(), current_lines.end(), [y](const RasterizeLine* l0, const RasterizeLine* l1) {
				const float x0 = l0->get_x(y);
				const float x1 = l1->get_x(y);
				if (x0 == x1) {
					return l0->m < l1->m;
				}
				return x0 < x1;
			});
			float next_y = event.y;
			// find intersections
			for (size_t i = 1; i < current_lines.size(); ++i) {
				const RasterizeLine& l0 = *current_lines[i-1];
				const RasterizeLine& l1 = *current_lines[i];
				if (l0.m != l1.m) {
					const float intersection = intersect(l0, l1);
					if (y < intersection && intersection < next_y) {
						next_y = intersection;
					}
				}
			}
			Strip strip(y, next_y);
			for (const RasterizeLine* line: current_lines) {
				strip.lines.push_back(*line);
			}
			rasterize_strip(strip, pixmap);
			y = next_y;
		}
		switch (event.type) {
		case Event::Type::LINE_START:
			current_lines.push_back(&lines[event.index]);
			break;
		case Event::Type::LINE_END:
			current_lines.erase(std::find(current_lines.begin(), current_lines.end(), &lines[event.index]));
			break;
		}
	}

	write_png(pixmap, file_name);
}